

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  int result;
  ThreadPool pool;
  undefined4 local_15c;
  ThreadPool local_158;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  function<void_()> local_70;
  function<void_()> local_50;
  
  local_158._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ThreadPool::init(&local_158,(EVP_PKEY_CTX *)0x5);
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_d8._M_unused._M_object = operator_new(0x10);
  *(code **)local_d8._M_unused._0_8_ = test1;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0x100000002;
  pcStack_c0 = std::_Function_handler<void_(),_std::_Bind<void_(*(int,_int))(int,_int)>_>::_M_invoke
  ;
  local_c8 = std::_Function_handler<void_(),_std::_Bind<void_(*(int,_int))(int,_int)>_>::_M_manager;
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = callback;
  local_50._M_invoker = std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_manager;
  ThreadPool::add(&local_158,(function<void_()> *)&local_d8,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x18);
  *(code **)local_f8._M_unused._0_8_ = test2;
  *(undefined8 *)((long)local_f8._M_unused._0_8_ + 8) = 0x4000000000000000;
  *(undefined8 *)((long)local_f8._M_unused._0_8_ + 0x10) = 0x3ff0000000000000;
  pcStack_e0 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(double,_double))(double,_double)>_>::
               _M_invoke;
  local_e8 = std::_Function_handler<void_(),_std::_Bind<void_(*(double,_double))(double,_double)>_>
             ::_M_manager;
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70.super__Function_base._M_functor._M_unused._M_object = callback;
  local_70._M_invoker = std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_invoke;
  local_70.super__Function_base._M_manager =
       std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_manager;
  ThreadPool::add(&local_158,(function<void_()> *)&local_f8,&local_70);
  if (local_70.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.super__Function_base._M_manager)
              ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x18);
  *(code **)local_118._M_unused._0_8_ = test2;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0x4000000000000000;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x10) = 0x3ff0000000000000;
  pcStack_100 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(double,_double))(double,_double)>_>::
                _M_invoke;
  local_108 = std::_Function_handler<void_(),_std::_Bind<void_(*(double,_double))(double,_double)>_>
              ::_M_manager;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  ThreadPool::add(&local_158,(function<void_()> *)&local_118,(function<void_()> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  local_15c = 0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138._M_unused._M_object = operator_new(0x20);
  *(code **)local_138._M_unused._0_8_ = test3;
  local_90._M_unused._M_object = &local_15c;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 8) = local_90._M_unused._M_object;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 0x10) = 0x4000000000000000;
  *(undefined8 *)((long)local_138._M_unused._0_8_ + 0x18) = 0x3ff0000000000000;
  pcStack_120 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(double,_double,_std::reference_wrapper<int>))(int,_int,_int_&)>_>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_std::_Bind<void_(*(double,_double,_std::reference_wrapper<int>))(int,_int,_int_&)>_>
              ::_M_manager;
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/EricDDK[P]ThreadPool/test.cpp:37:58)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/EricDDK[P]ThreadPool/test.cpp:37:58)>
             ::_M_manager;
  ThreadPool::add(&local_158,(function<void_()> *)&local_138,(function<void_()> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  system("pause");
  ThreadPool::~ThreadPool(&local_158);
  return 1;
}

Assistant:

int main()
{
	ThreadPool pool;
	pool.init(5);
	pool.add(std::bind(&test1, 1, 2), std::bind(&callback));
	pool.add(std::bind(&test2, 1.0, 2.0), std::bind(&callback));
	pool.add(std::bind(&test2, 1.0, 2.0));

	//Add a unit test that asynchronously passes the reference and gets the asynchronous reference result in the callback function.
	int result = 0;
	pool.add(std::bind(&test3, 1.0, 2.0, std::ref(result)), [&]()
	{
		std::cout << "result = " << result << std::endl;
	});

	system("pause");
	return 1;
}